

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  __m128i *out0;
  __m128i *palVar1;
  byte bVar2;
  __m128i *out1;
  __m128i *palVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar18;
  int iVar20;
  undefined1 auVar16 [16];
  uint uVar19;
  uint uVar21;
  int iVar22;
  uint uVar23;
  undefined1 auVar17 [16];
  int iVar24;
  int iVar26;
  int iVar27;
  undefined1 auVar25 [16];
  int iVar28;
  uint uVar29;
  uint uVar33;
  int iVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar35;
  int iVar36;
  uint uVar37;
  undefined1 auVar32 [16];
  int iVar38;
  uint uVar39;
  int iVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar47;
  uint uVar48;
  int iVar49;
  int iVar53;
  int iVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar52 [16];
  uint uVar58;
  uint uVar59;
  uint uVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  uint uVar66;
  undefined1 auVar60 [16];
  int iVar67;
  uint uVar68;
  int iVar69;
  uint uVar70;
  int iVar71;
  int iVar74;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar75;
  int iVar78;
  int iVar79;
  undefined1 auVar76 [16];
  int iVar80;
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  uint uVar85;
  uint uVar86;
  int iVar88;
  uint uVar89;
  uint uVar90;
  int iVar91;
  uint uVar92;
  int iVar93;
  uint uVar94;
  int iVar95;
  uint uVar96;
  int iVar97;
  uint uVar98;
  undefined1 auVar87 [16];
  uint uVar99;
  uint uVar102;
  uint uVar103;
  undefined1 auVar100 [16];
  uint uVar104;
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  undefined1 auVar106 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  out0 = (__m128i *)(ulong)(uint)bd;
  out1 = (__m128i *)(ulong)(uint)do_cols;
  auVar17._8_4_ = 0xfec;
  auVar17._0_8_ = 0xfec00000fec;
  auVar17._12_4_ = 0xfec;
  auVar32._8_4_ = 0x191;
  auVar32._0_8_ = 0x19100000191;
  auVar32._12_4_ = 0x191;
  auVar105._8_4_ = 0xe1c;
  auVar105._0_8_ = 0xe1c00000e1c;
  auVar105._12_4_ = 0xe1c;
  auVar52._8_4_ = 0x78b;
  auVar52._0_8_ = 0x78b0000078b;
  auVar52._12_4_ = 0x78b;
  auVar83._8_4_ = 0xa26;
  auVar83._0_8_ = 0xa2600000a26;
  auVar83._12_4_ = 0xa26;
  auVar77._8_4_ = 0xc5e;
  auVar77._0_8_ = 0xc5e00000c5e;
  auVar77._12_4_ = 0xc5e;
  auVar82._8_4_ = 0x4a5;
  auVar82._0_8_ = 0x4a5000004a5;
  auVar82._12_4_ = 0x4a5;
  auVar81._8_4_ = 0xf50;
  auVar81._0_8_ = 0xf5000000f50;
  auVar81._12_4_ = 0xf50;
  auVar6 = pmulld((undefined1  [16])in[0xe],auVar17);
  auVar30 = pmulld(auVar17,(undefined1  [16])*in);
  auVar16 = pmulld((undefined1  [16])*in,auVar32);
  auVar76 = pmulld((undefined1  [16])in[0xe],auVar32);
  auVar7 = pmulld((undefined1  [16])in[10],auVar105);
  auVar40 = pmulld(auVar105,(undefined1  [16])in[4]);
  auVar25 = pmulld((undefined1  [16])in[4],auVar52);
  auVar31 = pmulld((undefined1  [16])in[10],auVar52);
  auVar41 = pmulld((undefined1  [16])in[6],auVar83);
  auVar8 = pmulld((undefined1  [16])in[8],auVar77);
  auVar4 = pmulld((undefined1  [16])in[6],auVar77);
  auVar50 = pmulld((undefined1  [16])in[8],auVar83);
  auVar42 = pmulld((undefined1  [16])in[2],auVar82);
  auVar51 = pmulld((undefined1  [16])in[0xc],auVar81);
  auVar60 = pmulld((undefined1  [16])in[2],auVar81);
  auVar72 = pmulld((undefined1  [16])in[0xc],auVar82);
  auVar73 = pmovsxwd(auVar72,0x800080008000800);
  iVar65 = auVar73._0_4_;
  iVar69 = auVar73._4_4_;
  iVar71 = auVar73._8_4_;
  iVar74 = auVar73._12_4_;
  iVar14 = auVar16._0_4_ + auVar6._0_4_ + iVar65 >> 0xc;
  iVar18 = auVar16._4_4_ + auVar6._4_4_ + iVar69 >> 0xc;
  iVar20 = auVar16._8_4_ + auVar6._8_4_ + iVar71 >> 0xc;
  iVar22 = auVar16._12_4_ + auVar6._12_4_ + iVar74 >> 0xc;
  iVar5 = auVar8._0_4_ + auVar41._0_4_ + iVar65 >> 0xc;
  iVar9 = auVar8._4_4_ + auVar41._4_4_ + iVar69 >> 0xc;
  iVar10 = auVar8._8_4_ + auVar41._8_4_ + iVar71 >> 0xc;
  iVar12 = auVar8._12_4_ + auVar41._12_4_ + iVar74 >> 0xc;
  iVar84 = iVar5 + iVar14;
  iVar88 = iVar9 + iVar18;
  iVar91 = iVar10 + iVar20;
  iVar95 = iVar12 + iVar22;
  iVar14 = iVar14 - iVar5;
  iVar18 = iVar18 - iVar9;
  iVar20 = iVar20 - iVar10;
  iVar22 = iVar22 - iVar12;
  iVar75 = (auVar76._0_4_ - auVar30._0_4_) + iVar65 >> 0xc;
  iVar78 = (auVar76._4_4_ - auVar30._4_4_) + iVar69 >> 0xc;
  iVar79 = (auVar76._8_4_ - auVar30._8_4_) + iVar71 >> 0xc;
  iVar80 = (auVar76._12_4_ - auVar30._12_4_) + iVar74 >> 0xc;
  iVar5 = (auVar4._0_4_ - auVar50._0_4_) + iVar65 >> 0xc;
  iVar9 = (auVar4._4_4_ - auVar50._4_4_) + iVar69 >> 0xc;
  iVar10 = (auVar4._8_4_ - auVar50._8_4_) + iVar71 >> 0xc;
  iVar12 = (auVar4._12_4_ - auVar50._12_4_) + iVar74 >> 0xc;
  iVar38 = iVar5 + iVar75;
  iVar43 = iVar9 + iVar78;
  iVar45 = iVar10 + iVar79;
  iVar47 = iVar12 + iVar80;
  iVar75 = iVar75 - iVar5;
  iVar78 = iVar78 - iVar9;
  iVar79 = iVar79 - iVar10;
  iVar80 = iVar80 - iVar12;
  iVar24 = auVar25._0_4_ + auVar7._0_4_ + iVar65 >> 0xc;
  iVar26 = auVar25._4_4_ + auVar7._4_4_ + iVar69 >> 0xc;
  iVar27 = auVar25._8_4_ + auVar7._8_4_ + iVar71 >> 0xc;
  iVar28 = auVar25._12_4_ + auVar7._12_4_ + iVar74 >> 0xc;
  iVar5 = auVar51._0_4_ + auVar42._0_4_ + iVar65 >> 0xc;
  iVar9 = auVar51._4_4_ + auVar42._4_4_ + iVar69 >> 0xc;
  iVar54 = auVar51._8_4_ + auVar42._8_4_ + iVar71 >> 0xc;
  iVar56 = auVar51._12_4_ + auVar42._12_4_ + iVar74 >> 0xc;
  iVar10 = iVar5 + iVar24;
  iVar12 = iVar9 + iVar26;
  iVar11 = iVar54 + iVar27;
  iVar13 = iVar56 + iVar28;
  iVar24 = iVar24 - iVar5;
  iVar26 = iVar26 - iVar9;
  iVar27 = iVar27 - iVar54;
  iVar28 = iVar28 - iVar56;
  iVar54 = (auVar31._0_4_ - auVar40._0_4_) + iVar65 >> 0xc;
  iVar56 = (auVar31._4_4_ - auVar40._4_4_) + iVar69 >> 0xc;
  iVar34 = (auVar31._8_4_ - auVar40._8_4_) + iVar71 >> 0xc;
  iVar36 = (auVar31._12_4_ - auVar40._12_4_) + iVar74 >> 0xc;
  iVar5 = (auVar60._0_4_ - auVar72._0_4_) + iVar65 >> 0xc;
  iVar9 = (auVar60._4_4_ - auVar72._4_4_) + iVar69 >> 0xc;
  iVar63 = (auVar60._8_4_ - auVar72._8_4_) + iVar71 >> 0xc;
  iVar67 = (auVar60._12_4_ - auVar72._12_4_) + iVar74 >> 0xc;
  iVar49 = iVar5 + iVar54;
  iVar53 = iVar9 + iVar56;
  iVar55 = iVar63 + iVar34;
  iVar57 = iVar67 + iVar36;
  iVar54 = iVar54 - iVar5;
  iVar56 = iVar56 - iVar9;
  iVar34 = iVar34 - iVar63;
  iVar36 = iVar36 - iVar67;
  iVar9 = do_cols + 6 + (uint)(bit == 0) * 2;
  iVar5 = 0x8000;
  if (0xf < iVar9) {
    iVar5 = 1 << ((char)iVar9 - 1U & 0x1f);
  }
  iVar9 = -iVar5;
  iVar5 = iVar5 + -1;
  auVar50._8_4_ = 0x61f;
  auVar50._0_8_ = 0x61f0000061f;
  auVar50._12_4_ = 0x61f;
  uVar15 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar19 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
  uVar21 = (uint)(iVar20 < iVar9) * iVar9 | (uint)(iVar20 >= iVar9) * iVar20;
  uVar23 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  auVar6._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar6._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar6._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar6._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar75 < iVar9) * iVar9 | (uint)(iVar75 >= iVar9) * iVar75;
  uVar19 = (uint)(iVar78 < iVar9) * iVar9 | (uint)(iVar78 >= iVar9) * iVar78;
  uVar21 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar23 = (uint)(iVar80 < iVar9) * iVar9 | (uint)(iVar80 >= iVar9) * iVar80;
  auVar31._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar31._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar31._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar31._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  auVar41._8_4_ = 0xec8;
  auVar41._0_8_ = 0xec800000ec8;
  auVar41._12_4_ = 0xec8;
  auVar4 = pmulld(auVar6,auVar41);
  auVar25 = pmulld(auVar41,auVar31);
  auVar40 = pmulld(auVar31,auVar50);
  auVar7 = pmulld(auVar6,auVar50);
  auVar30._8_4_ = 0xfffff9e1;
  auVar30._0_8_ = 0xfffff9e1fffff9e1;
  auVar30._12_4_ = 0xfffff9e1;
  uVar15 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar19 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar21 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar23 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  auVar8._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar8._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar8._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar8._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar54 < iVar9) * iVar9 | (uint)(iVar54 >= iVar9) * iVar54;
  uVar19 = (uint)(iVar56 < iVar9) * iVar9 | (uint)(iVar56 >= iVar9) * iVar56;
  uVar21 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
  uVar23 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
  auVar16._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar16._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar16._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar16._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  auVar6 = pmulld(auVar8,auVar30);
  auVar31 = pmulld(auVar30,auVar16);
  auVar16 = pmulld(auVar16,auVar41);
  auVar8 = pmulld(auVar8,auVar41);
  uVar15 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar19 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  uVar21 = (uint)(iVar91 < iVar9) * iVar9 | (uint)(iVar91 >= iVar9) * iVar91;
  uVar23 = (uint)(iVar95 < iVar9) * iVar9 | (uint)(iVar95 >= iVar9) * iVar95;
  uVar85 = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  uVar89 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar92 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar96 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar19 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar21 = (uint)(iVar11 < iVar9) * iVar9 | (uint)(iVar11 >= iVar9) * iVar11;
  uVar23 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar15 = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  uVar19 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar21 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar23 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  iVar10 = uVar15 + uVar85;
  iVar12 = uVar19 + uVar89;
  iVar11 = uVar21 + uVar92;
  iVar13 = uVar23 + uVar96;
  iVar91 = uVar85 - uVar15;
  iVar95 = uVar89 - uVar19;
  iVar93 = uVar92 - uVar21;
  iVar97 = uVar96 - uVar23;
  uVar15 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
  uVar19 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  uVar21 = (uint)(iVar45 < iVar9) * iVar9 | (uint)(iVar45 >= iVar9) * iVar45;
  uVar23 = (uint)(iVar47 < iVar9) * iVar9 | (uint)(iVar47 >= iVar9) * iVar47;
  uVar15 = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  uVar19 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar21 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar23 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar85 = (uint)(iVar49 < iVar9) * iVar9 | (uint)(iVar49 >= iVar9) * iVar49;
  uVar89 = (uint)(iVar53 < iVar9) * iVar9 | (uint)(iVar53 >= iVar9) * iVar53;
  uVar92 = (uint)(iVar55 < iVar9) * iVar9 | (uint)(iVar55 >= iVar9) * iVar55;
  uVar96 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
  uVar85 = (uint)(iVar5 < (int)uVar85) * iVar5 | (iVar5 >= (int)uVar85) * uVar85;
  uVar89 = (uint)(iVar5 < (int)uVar89) * iVar5 | (iVar5 >= (int)uVar89) * uVar89;
  uVar92 = (uint)(iVar5 < (int)uVar92) * iVar5 | (iVar5 >= (int)uVar92) * uVar92;
  uVar96 = (uint)(iVar5 < (int)uVar96) * iVar5 | (iVar5 >= (int)uVar96) * uVar96;
  iVar63 = uVar85 + uVar15;
  iVar67 = uVar89 + uVar19;
  iVar75 = uVar92 + uVar21;
  iVar78 = uVar96 + uVar23;
  iVar49 = uVar15 - uVar85;
  iVar53 = uVar19 - uVar89;
  iVar55 = uVar21 - uVar92;
  iVar57 = uVar23 - uVar96;
  iVar79 = auVar40._0_4_ + auVar4._0_4_ + iVar65 >> 0xc;
  iVar80 = auVar40._4_4_ + auVar4._4_4_ + iVar69 >> 0xc;
  iVar84 = auVar40._8_4_ + auVar4._8_4_ + iVar71 >> 0xc;
  iVar88 = auVar40._12_4_ + auVar4._12_4_ + iVar74 >> 0xc;
  iVar24 = auVar16._0_4_ + auVar6._0_4_ + iVar65 >> 0xc;
  iVar26 = auVar16._4_4_ + auVar6._4_4_ + iVar69 >> 0xc;
  iVar27 = auVar16._8_4_ + auVar6._8_4_ + iVar71 >> 0xc;
  iVar28 = auVar16._12_4_ + auVar6._12_4_ + iVar74 >> 0xc;
  iVar14 = iVar24 + iVar79;
  iVar18 = iVar26 + iVar80;
  iVar20 = iVar27 + iVar84;
  iVar22 = iVar28 + iVar88;
  iVar79 = iVar79 - iVar24;
  iVar80 = iVar80 - iVar26;
  iVar84 = iVar84 - iVar27;
  iVar88 = iVar88 - iVar28;
  iVar24 = (auVar7._0_4_ - auVar25._0_4_) + iVar65 >> 0xc;
  iVar26 = (auVar7._4_4_ - auVar25._4_4_) + iVar69 >> 0xc;
  iVar27 = (auVar7._8_4_ - auVar25._8_4_) + iVar71 >> 0xc;
  iVar28 = (auVar7._12_4_ - auVar25._12_4_) + iVar74 >> 0xc;
  iVar54 = (auVar8._0_4_ - auVar31._0_4_) + iVar65 >> 0xc;
  iVar56 = (auVar8._4_4_ - auVar31._4_4_) + iVar69 >> 0xc;
  iVar34 = (auVar8._8_4_ - auVar31._8_4_) + iVar71 >> 0xc;
  iVar36 = (auVar8._12_4_ - auVar31._12_4_) + iVar74 >> 0xc;
  iVar38 = iVar54 + iVar24;
  iVar43 = iVar56 + iVar26;
  iVar45 = iVar34 + iVar27;
  iVar47 = iVar36 + iVar28;
  iVar24 = iVar24 - iVar54;
  iVar26 = iVar26 - iVar56;
  iVar27 = iVar27 - iVar34;
  iVar28 = iVar28 - iVar36;
  uVar15 = (uint)(iVar91 < iVar9) * iVar9 | (uint)(iVar91 >= iVar9) * iVar91;
  uVar19 = (uint)(iVar95 < iVar9) * iVar9 | (uint)(iVar95 >= iVar9) * iVar95;
  uVar21 = (uint)(iVar93 < iVar9) * iVar9 | (uint)(iVar93 >= iVar9) * iVar93;
  uVar23 = (uint)(iVar97 < iVar9) * iVar9 | (uint)(iVar97 >= iVar9) * iVar97;
  auVar42._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar42._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar42._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar42._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar49 < iVar9) * iVar9 | (uint)(iVar49 >= iVar9) * iVar49;
  uVar19 = (uint)(iVar53 < iVar9) * iVar9 | (uint)(iVar53 >= iVar9) * iVar53;
  uVar21 = (uint)(iVar55 < iVar9) * iVar9 | (uint)(iVar55 >= iVar9) * iVar55;
  uVar23 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
  auVar25._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar25._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar25._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar25._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  auVar7._8_4_ = 0xb50;
  auVar7._0_8_ = 0xb5000000b50;
  auVar7._12_4_ = 0xb50;
  auVar16 = pmulld(auVar42,auVar7);
  auVar6 = pmulld(auVar25,auVar7);
  uVar15 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar19 = (uint)(iVar80 < iVar9) * iVar9 | (uint)(iVar80 >= iVar9) * iVar80;
  uVar21 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar23 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  auVar40._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar40._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar40._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar40._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar19 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar21 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar23 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  auVar4._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar4._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar4._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar4._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  auVar8 = pmulld(auVar40,auVar7);
  auVar4 = pmulld(auVar4,auVar7);
  uVar15 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar19 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar21 = (uint)(iVar11 < iVar9) * iVar9 | (uint)(iVar11 >= iVar9) * iVar11;
  uVar23 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar58 = (uint)(iVar63 < iVar9) * iVar9 | (uint)(iVar63 >= iVar9) * iVar63;
  uVar61 = (uint)(iVar67 < iVar9) * iVar9 | (uint)(iVar67 >= iVar9) * iVar67;
  uVar64 = (uint)(iVar75 < iVar9) * iVar9 | (uint)(iVar75 >= iVar9) * iVar75;
  uVar68 = (uint)(iVar78 < iVar9) * iVar9 | (uint)(iVar78 >= iVar9) * iVar78;
  uVar85 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar89 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
  uVar92 = (uint)(iVar20 < iVar9) * iVar9 | (uint)(iVar20 >= iVar9) * iVar20;
  uVar96 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  uVar29 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
  uVar33 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  uVar35 = (uint)(iVar45 < iVar9) * iVar9 | (uint)(iVar45 >= iVar9) * iVar45;
  uVar37 = (uint)(iVar47 < iVar9) * iVar9 | (uint)(iVar47 >= iVar9) * iVar47;
  palVar3 = out1;
  if (bit == 0) {
    bVar2 = 10;
    if (10 < do_cols) {
      bVar2 = (byte)do_cols;
    }
    iVar10 = 0x20 << (bVar2 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar10;
    clamp_hi_out[0]._0_4_ = iVar10 + -1;
    in1[1] = (longlong)clamp_hi_out;
    in1[0] = (longlong)clamp_lo_out;
    in0[1] = (longlong)(out + 2);
    in0[0] = (longlong)out;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    neg_shift_sse4_1(in0,in1,out0,out1,(__m128i *)0xfec00000fec,auVar17._8_8_,0x78b);
    in1_00[1] = (longlong)clamp_hi_out;
    in1_00[0] = (longlong)clamp_lo_out;
    in0_00[1] = (longlong)(out + 6);
    in0_00[0] = (longlong)(out + 4);
    neg_shift_sse4_1(in0_00,in1_00,out0,palVar3,auVar17._0_8_,auVar17._8_8_,0x78b);
    in1_01[1] = (longlong)clamp_hi_out;
    in1_01[0] = (longlong)clamp_lo_out;
    in0_01[1] = (longlong)(out + 10);
    in0_01[0] = (longlong)(out + 8);
    neg_shift_sse4_1(in0_01,in1_01,out0,palVar3,auVar17._0_8_,auVar17._8_8_,0x78b);
    in1_02[1] = (longlong)clamp_hi_out;
    in1_02[0] = (longlong)clamp_lo_out;
    in0_02[1] = (longlong)(out + 0xe);
    in0_02[0] = (longlong)(out + 0xc);
    neg_shift_sse4_1(in0_02,in1_02,out0,palVar3,auVar17._0_8_,auVar17._8_8_,0x78b);
    auVar73 = pmovsxwd(auVar73,0x800080008000800);
  }
  else {
    *(uint *)*out = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
    *(uint *)((long)*out + 4) =
         (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
    *(uint *)(*out + 1) = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
    *(uint *)out[2] = -((uint)(iVar5 < (int)uVar85) * iVar5 | (iVar5 >= (int)uVar85) * uVar85);
    *(uint *)((long)out[2] + 4) =
         -((uint)(iVar5 < (int)uVar89) * iVar5 | (iVar5 >= (int)uVar89) * uVar89);
    *(uint *)(out[2] + 1) = -((uint)(iVar5 < (int)uVar92) * iVar5 | (iVar5 >= (int)uVar92) * uVar92)
    ;
    *(uint *)((long)out[2] + 0xc) =
         -((uint)(iVar5 < (int)uVar96) * iVar5 | (iVar5 >= (int)uVar96) * uVar96);
    *(int *)out[4] = auVar4._0_4_ + auVar8._0_4_ + iVar65 >> 0xc;
    *(int *)((long)out[4] + 4) = auVar4._4_4_ + auVar8._4_4_ + iVar69 >> 0xc;
    *(int *)(out[4] + 1) = auVar4._8_4_ + auVar8._8_4_ + iVar71 >> 0xc;
    *(int *)((long)out[4] + 0xc) = auVar4._12_4_ + auVar8._12_4_ + iVar74 >> 0xc;
    *(int *)out[6] = -(auVar6._0_4_ + auVar16._0_4_ + iVar65 >> 0xc);
    *(int *)((long)out[6] + 4) = -(auVar6._4_4_ + auVar16._4_4_ + iVar69 >> 0xc);
    *(int *)(out[6] + 1) = -(auVar6._8_4_ + auVar16._8_4_ + iVar71 >> 0xc);
    *(int *)((long)out[6] + 0xc) = -(auVar6._12_4_ + auVar16._12_4_ + iVar74 >> 0xc);
    *(int *)out[8] = (auVar16._0_4_ - auVar6._0_4_) + iVar65 >> 0xc;
    *(int *)((long)out[8] + 4) = (auVar16._4_4_ - auVar6._4_4_) + iVar69 >> 0xc;
    *(int *)(out[8] + 1) = (auVar16._8_4_ - auVar6._8_4_) + iVar71 >> 0xc;
    *(int *)((long)out[8] + 0xc) = (auVar16._12_4_ - auVar6._12_4_) + iVar74 >> 0xc;
    *(int *)out[10] = -((auVar8._0_4_ - auVar4._0_4_) + iVar65 >> 0xc);
    *(int *)((long)out[10] + 4) = -((auVar8._4_4_ - auVar4._4_4_) + iVar69 >> 0xc);
    *(int *)(out[10] + 1) = -((auVar8._8_4_ - auVar4._8_4_) + iVar71 >> 0xc);
    *(int *)((long)out[10] + 0xc) = -((auVar8._12_4_ - auVar4._12_4_) + iVar74 >> 0xc);
    *(uint *)out[0xc] = (uint)(iVar5 < (int)uVar29) * iVar5 | (iVar5 >= (int)uVar29) * uVar29;
    *(uint *)((long)out[0xc] + 4) =
         (uint)(iVar5 < (int)uVar33) * iVar5 | (iVar5 >= (int)uVar33) * uVar33;
    *(uint *)(out[0xc] + 1) = (uint)(iVar5 < (int)uVar35) * iVar5 | (iVar5 >= (int)uVar35) * uVar35;
    *(uint *)((long)out[0xc] + 0xc) =
         (uint)(iVar5 < (int)uVar37) * iVar5 | (iVar5 >= (int)uVar37) * uVar37;
    *(uint *)out[0xe] = -((uint)(iVar5 < (int)uVar58) * iVar5 | (iVar5 >= (int)uVar58) * uVar58);
    *(uint *)((long)out[0xe] + 4) =
         -((uint)(iVar5 < (int)uVar61) * iVar5 | (iVar5 >= (int)uVar61) * uVar61);
    *(uint *)(out[0xe] + 1) =
         -((uint)(iVar5 < (int)uVar64) * iVar5 | (iVar5 >= (int)uVar64) * uVar64);
    *(uint *)((long)out[0xe] + 0xc) =
         -((uint)(iVar5 < (int)uVar68) * iVar5 | (iVar5 >= (int)uVar68) * uVar68);
  }
  auVar4 = pmulld((undefined1  [16])in[0xf],auVar17);
  auVar16 = pmulld(auVar17,(undefined1  [16])in[1]);
  auVar17 = pmulld((undefined1  [16])in[1],auVar32);
  auVar72 = pmulld((undefined1  [16])in[0xf],auVar32);
  auVar6 = pmulld((undefined1  [16])in[0xb],auVar105);
  auVar76 = pmulld(auVar105,(undefined1  [16])in[5]);
  auVar31 = pmulld((undefined1  [16])in[5],auVar52);
  auVar32 = pmulld((undefined1  [16])in[0xb],auVar52);
  auVar40 = pmulld((undefined1  [16])in[7],auVar83);
  auVar51 = pmulld(auVar83,(undefined1  [16])in[9]);
  auVar25 = pmulld((undefined1  [16])in[9],auVar77);
  auVar8 = pmulld((undefined1  [16])in[7],auVar77);
  auVar42 = pmulld((undefined1  [16])in[3],auVar82);
  auVar77 = pmulld(auVar82,(undefined1  [16])in[0xd]);
  auVar52 = pmulld((undefined1  [16])in[0xd],auVar81);
  auVar60 = pmulld((undefined1  [16])in[3],auVar81);
  iVar71 = auVar73._0_4_;
  iVar74 = auVar73._4_4_;
  iVar75 = auVar73._8_4_;
  iVar78 = auVar73._12_4_;
  iVar24 = auVar17._0_4_ + auVar4._0_4_ + iVar71 >> 0xc;
  iVar26 = auVar17._4_4_ + auVar4._4_4_ + iVar74 >> 0xc;
  iVar27 = auVar17._8_4_ + auVar4._8_4_ + iVar75 >> 0xc;
  iVar28 = auVar17._12_4_ + auVar4._12_4_ + iVar78 >> 0xc;
  iVar91 = (auVar72._0_4_ - auVar16._0_4_) + iVar71 >> 0xc;
  iVar95 = (auVar72._4_4_ - auVar16._4_4_) + iVar74 >> 0xc;
  iVar93 = (auVar72._8_4_ - auVar16._8_4_) + iVar75 >> 0xc;
  iVar97 = (auVar72._12_4_ - auVar16._12_4_) + iVar78 >> 0xc;
  iVar54 = auVar31._0_4_ + auVar6._0_4_ + iVar71 >> 0xc;
  iVar56 = auVar31._4_4_ + auVar6._4_4_ + iVar74 >> 0xc;
  iVar34 = auVar31._8_4_ + auVar6._8_4_ + iVar75 >> 0xc;
  iVar36 = auVar31._12_4_ + auVar6._12_4_ + iVar78 >> 0xc;
  iVar38 = (auVar32._0_4_ - auVar76._0_4_) + iVar71 >> 0xc;
  iVar43 = (auVar32._4_4_ - auVar76._4_4_) + iVar74 >> 0xc;
  iVar45 = (auVar32._8_4_ - auVar76._8_4_) + iVar75 >> 0xc;
  iVar47 = (auVar32._12_4_ - auVar76._12_4_) + iVar78 >> 0xc;
  iVar14 = auVar25._0_4_ + auVar40._0_4_ + iVar71 >> 0xc;
  iVar18 = auVar25._4_4_ + auVar40._4_4_ + iVar74 >> 0xc;
  iVar20 = auVar25._8_4_ + auVar40._8_4_ + iVar75 >> 0xc;
  iVar22 = auVar25._12_4_ + auVar40._12_4_ + iVar78 >> 0xc;
  iVar10 = (auVar8._0_4_ - auVar51._0_4_) + iVar71 >> 0xc;
  iVar12 = (auVar8._4_4_ - auVar51._4_4_) + iVar74 >> 0xc;
  iVar11 = (auVar8._8_4_ - auVar51._8_4_) + iVar75 >> 0xc;
  iVar13 = (auVar8._12_4_ - auVar51._12_4_) + iVar78 >> 0xc;
  iVar49 = auVar52._0_4_ + auVar42._0_4_ + iVar71 >> 0xc;
  iVar53 = auVar52._4_4_ + auVar42._4_4_ + iVar74 >> 0xc;
  iVar55 = auVar52._8_4_ + auVar42._8_4_ + iVar75 >> 0xc;
  iVar57 = auVar52._12_4_ + auVar42._12_4_ + iVar78 >> 0xc;
  iVar63 = (auVar60._0_4_ - auVar77._0_4_) + iVar71 >> 0xc;
  iVar67 = (auVar60._4_4_ - auVar77._4_4_) + iVar74 >> 0xc;
  iVar65 = (auVar60._8_4_ - auVar77._8_4_) + iVar75 >> 0xc;
  iVar69 = (auVar60._12_4_ - auVar77._12_4_) + iVar78 >> 0xc;
  iVar79 = iVar14 + iVar24;
  iVar80 = iVar18 + iVar26;
  iVar84 = iVar20 + iVar27;
  iVar88 = iVar22 + iVar28;
  iVar24 = iVar24 - iVar14;
  iVar26 = iVar26 - iVar18;
  iVar27 = iVar27 - iVar20;
  iVar28 = iVar28 - iVar22;
  uVar15 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar19 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar21 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar23 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  auVar51._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar51._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar51._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar51._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  iVar14 = iVar10 + iVar91;
  iVar18 = iVar12 + iVar95;
  iVar20 = iVar11 + iVar93;
  iVar22 = iVar13 + iVar97;
  iVar91 = iVar91 - iVar10;
  iVar95 = iVar95 - iVar12;
  iVar93 = iVar93 - iVar11;
  iVar97 = iVar97 - iVar13;
  uVar15 = (uint)(iVar91 < iVar9) * iVar9 | (uint)(iVar91 >= iVar9) * iVar91;
  uVar19 = (uint)(iVar95 < iVar9) * iVar9 | (uint)(iVar95 >= iVar9) * iVar95;
  uVar21 = (uint)(iVar93 < iVar9) * iVar9 | (uint)(iVar93 >= iVar9) * iVar93;
  uVar23 = (uint)(iVar97 < iVar9) * iVar9 | (uint)(iVar97 >= iVar9) * iVar97;
  auVar100._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar100._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar100._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar100._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  iVar10 = iVar49 + iVar54;
  iVar12 = iVar53 + iVar56;
  iVar11 = iVar55 + iVar34;
  iVar13 = iVar57 + iVar36;
  iVar54 = iVar54 - iVar49;
  iVar56 = iVar56 - iVar53;
  iVar34 = iVar34 - iVar55;
  iVar36 = iVar36 - iVar57;
  iVar24 = iVar63 + iVar38;
  iVar26 = iVar67 + iVar43;
  iVar27 = iVar65 + iVar45;
  iVar28 = iVar69 + iVar47;
  iVar38 = iVar38 - iVar63;
  iVar43 = iVar43 - iVar67;
  iVar45 = iVar45 - iVar65;
  iVar47 = iVar47 - iVar69;
  auVar4 = pmulld(auVar51,auVar41);
  auVar17 = pmulld(auVar41,auVar100);
  auVar31 = pmulld(auVar100,auVar50);
  auVar8 = pmulld(auVar51,auVar50);
  uVar15 = (uint)(iVar54 < iVar9) * iVar9 | (uint)(iVar54 >= iVar9) * iVar54;
  uVar19 = (uint)(iVar56 < iVar9) * iVar9 | (uint)(iVar56 >= iVar9) * iVar56;
  uVar21 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
  uVar23 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
  auVar72._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar72._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar72._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar72._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
  uVar19 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  uVar21 = (uint)(iVar45 < iVar9) * iVar9 | (uint)(iVar45 >= iVar9) * iVar45;
  uVar23 = (uint)(iVar47 < iVar9) * iVar9 | (uint)(iVar47 >= iVar9) * iVar47;
  auVar73._0_4_ = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  auVar73._4_4_ = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  auVar73._8_4_ = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  auVar73._12_4_ = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  auVar6 = pmulld(auVar72,auVar30);
  auVar30 = pmulld(auVar30,auVar73);
  auVar25 = pmulld(auVar73,auVar41);
  auVar16 = pmulld(auVar72,auVar41);
  uVar15 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar19 = (uint)(iVar80 < iVar9) * iVar9 | (uint)(iVar80 >= iVar9) * iVar80;
  uVar21 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar23 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  uVar58 = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  uVar61 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar64 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar68 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar19 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
  uVar21 = (uint)(iVar20 < iVar9) * iVar9 | (uint)(iVar20 >= iVar9) * iVar20;
  uVar23 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  uVar85 = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  uVar89 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar92 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar96 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar15 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar19 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar21 = (uint)(iVar11 < iVar9) * iVar9 | (uint)(iVar11 >= iVar9) * iVar11;
  uVar23 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar15 = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
  uVar19 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar21 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar23 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  uVar29 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar33 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar35 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar37 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  uVar29 = (uint)(iVar5 < (int)uVar29) * iVar5 | (iVar5 >= (int)uVar29) * uVar29;
  uVar33 = (uint)(iVar5 < (int)uVar33) * iVar5 | (iVar5 >= (int)uVar33) * uVar33;
  uVar35 = (uint)(iVar5 < (int)uVar35) * iVar5 | (iVar5 >= (int)uVar35) * uVar35;
  uVar37 = (uint)(iVar5 < (int)uVar37) * iVar5 | (iVar5 >= (int)uVar37) * uVar37;
  iVar91 = auVar31._0_4_ + auVar4._0_4_ + iVar71 >> 0xc;
  iVar95 = auVar31._4_4_ + auVar4._4_4_ + iVar74 >> 0xc;
  iVar93 = auVar31._8_4_ + auVar4._8_4_ + iVar75 >> 0xc;
  iVar97 = auVar31._12_4_ + auVar4._12_4_ + iVar78 >> 0xc;
  iVar24 = (auVar8._0_4_ - auVar17._0_4_) + iVar71 >> 0xc;
  iVar26 = (auVar8._4_4_ - auVar17._4_4_) + iVar74 >> 0xc;
  iVar27 = (auVar8._8_4_ - auVar17._8_4_) + iVar75 >> 0xc;
  iVar28 = (auVar8._12_4_ - auVar17._12_4_) + iVar78 >> 0xc;
  iVar38 = auVar25._0_4_ + auVar6._0_4_ + iVar71 >> 0xc;
  iVar43 = auVar25._4_4_ + auVar6._4_4_ + iVar74 >> 0xc;
  iVar45 = auVar25._8_4_ + auVar6._8_4_ + iVar75 >> 0xc;
  iVar47 = auVar25._12_4_ + auVar6._12_4_ + iVar78 >> 0xc;
  iVar54 = (auVar16._0_4_ - auVar30._0_4_) + iVar71 >> 0xc;
  iVar56 = (auVar16._4_4_ - auVar30._4_4_) + iVar74 >> 0xc;
  iVar34 = (auVar16._8_4_ - auVar30._8_4_) + iVar75 >> 0xc;
  iVar36 = (auVar16._12_4_ - auVar30._12_4_) + iVar78 >> 0xc;
  iVar10 = uVar15 + uVar58;
  iVar12 = uVar19 + uVar61;
  iVar11 = uVar21 + uVar64;
  iVar13 = uVar23 + uVar68;
  iVar79 = uVar58 - uVar15;
  iVar80 = uVar61 - uVar19;
  iVar84 = uVar64 - uVar21;
  iVar88 = uVar68 - uVar23;
  iVar63 = uVar29 + uVar85;
  iVar67 = uVar33 + uVar89;
  iVar65 = uVar35 + uVar92;
  iVar69 = uVar37 + uVar96;
  iVar49 = uVar85 - uVar29;
  iVar53 = uVar89 - uVar33;
  iVar55 = uVar92 - uVar35;
  iVar57 = uVar96 - uVar37;
  iVar14 = iVar38 + iVar91;
  iVar18 = iVar43 + iVar95;
  iVar20 = iVar45 + iVar93;
  iVar22 = iVar47 + iVar97;
  iVar91 = iVar91 - iVar38;
  iVar95 = iVar95 - iVar43;
  iVar93 = iVar93 - iVar45;
  iVar97 = iVar97 - iVar47;
  iVar38 = iVar54 + iVar24;
  iVar43 = iVar56 + iVar26;
  iVar45 = iVar34 + iVar27;
  iVar47 = iVar36 + iVar28;
  iVar24 = iVar24 - iVar54;
  iVar26 = iVar26 - iVar56;
  iVar27 = iVar27 - iVar34;
  iVar28 = iVar28 - iVar36;
  uVar15 = (uint)(iVar10 < iVar9) * iVar9 | (uint)(iVar10 >= iVar9) * iVar10;
  uVar19 = (uint)(iVar12 < iVar9) * iVar9 | (uint)(iVar12 >= iVar9) * iVar12;
  uVar21 = (uint)(iVar11 < iVar9) * iVar9 | (uint)(iVar11 >= iVar9) * iVar11;
  uVar23 = (uint)(iVar13 < iVar9) * iVar9 | (uint)(iVar13 >= iVar9) * iVar13;
  uVar86 = (uint)(iVar79 < iVar9) * iVar9 | (uint)(iVar79 >= iVar9) * iVar79;
  uVar90 = (uint)(iVar80 < iVar9) * iVar9 | (uint)(iVar80 >= iVar9) * iVar80;
  uVar94 = (uint)(iVar84 < iVar9) * iVar9 | (uint)(iVar84 >= iVar9) * iVar84;
  uVar98 = (uint)(iVar88 < iVar9) * iVar9 | (uint)(iVar88 >= iVar9) * iVar88;
  uVar59 = (uint)(iVar63 < iVar9) * iVar9 | (uint)(iVar63 >= iVar9) * iVar63;
  uVar62 = (uint)(iVar67 < iVar9) * iVar9 | (uint)(iVar67 >= iVar9) * iVar67;
  uVar66 = (uint)(iVar65 < iVar9) * iVar9 | (uint)(iVar65 >= iVar9) * iVar65;
  uVar70 = (uint)(iVar69 < iVar9) * iVar9 | (uint)(iVar69 >= iVar9) * iVar69;
  uVar39 = (uint)(iVar49 < iVar9) * iVar9 | (uint)(iVar49 >= iVar9) * iVar49;
  uVar44 = (uint)(iVar53 < iVar9) * iVar9 | (uint)(iVar53 >= iVar9) * iVar53;
  uVar46 = (uint)(iVar55 < iVar9) * iVar9 | (uint)(iVar55 >= iVar9) * iVar55;
  uVar48 = (uint)(iVar57 < iVar9) * iVar9 | (uint)(iVar57 >= iVar9) * iVar57;
  uVar85 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  uVar89 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
  uVar92 = (uint)(iVar20 < iVar9) * iVar9 | (uint)(iVar20 >= iVar9) * iVar20;
  uVar96 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
  uVar99 = (uint)(iVar91 < iVar9) * iVar9 | (uint)(iVar91 >= iVar9) * iVar91;
  uVar102 = (uint)(iVar95 < iVar9) * iVar9 | (uint)(iVar95 >= iVar9) * iVar95;
  uVar103 = (uint)(iVar93 < iVar9) * iVar9 | (uint)(iVar93 >= iVar9) * iVar93;
  uVar104 = (uint)(iVar97 < iVar9) * iVar9 | (uint)(iVar97 >= iVar9) * iVar97;
  uVar58 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
  uVar61 = (uint)(iVar43 < iVar9) * iVar9 | (uint)(iVar43 >= iVar9) * iVar43;
  uVar64 = (uint)(iVar45 < iVar9) * iVar9 | (uint)(iVar45 >= iVar9) * iVar45;
  uVar68 = (uint)(iVar47 < iVar9) * iVar9 | (uint)(iVar47 >= iVar9) * iVar47;
  uVar29 = (uint)(iVar24 < iVar9) * iVar9 | (uint)(iVar24 >= iVar9) * iVar24;
  uVar33 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
  uVar35 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
  uVar37 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
  auVar87._0_4_ = (uint)(iVar5 < (int)uVar86) * iVar5 | (iVar5 >= (int)uVar86) * uVar86;
  auVar87._4_4_ = (uint)(iVar5 < (int)uVar90) * iVar5 | (iVar5 >= (int)uVar90) * uVar90;
  auVar87._8_4_ = (uint)(iVar5 < (int)uVar94) * iVar5 | (iVar5 >= (int)uVar94) * uVar94;
  auVar87._12_4_ = (uint)(iVar5 < (int)uVar98) * iVar5 | (iVar5 >= (int)uVar98) * uVar98;
  auVar76._0_4_ = (uint)(iVar5 < (int)uVar39) * iVar5 | (iVar5 >= (int)uVar39) * uVar39;
  auVar76._4_4_ = (uint)(iVar5 < (int)uVar44) * iVar5 | (iVar5 >= (int)uVar44) * uVar44;
  auVar76._8_4_ = (uint)(iVar5 < (int)uVar46) * iVar5 | (iVar5 >= (int)uVar46) * uVar46;
  auVar76._12_4_ = (uint)(iVar5 < (int)uVar48) * iVar5 | (iVar5 >= (int)uVar48) * uVar48;
  auVar101._0_4_ = (uint)(iVar5 < (int)uVar99) * iVar5 | (iVar5 >= (int)uVar99) * uVar99;
  auVar101._4_4_ = (uint)(iVar5 < (int)uVar102) * iVar5 | (iVar5 >= (int)uVar102) * uVar102;
  auVar101._8_4_ = (uint)(iVar5 < (int)uVar103) * iVar5 | (iVar5 >= (int)uVar103) * uVar103;
  auVar101._12_4_ = (uint)(iVar5 < (int)uVar104) * iVar5 | (iVar5 >= (int)uVar104) * uVar104;
  auVar60._0_4_ = (uint)(iVar5 < (int)uVar29) * iVar5 | (iVar5 >= (int)uVar29) * uVar29;
  auVar60._4_4_ = (uint)(iVar5 < (int)uVar33) * iVar5 | (iVar5 >= (int)uVar33) * uVar33;
  auVar60._8_4_ = (uint)(iVar5 < (int)uVar35) * iVar5 | (iVar5 >= (int)uVar35) * uVar35;
  auVar60._12_4_ = (uint)(iVar5 < (int)uVar37) * iVar5 | (iVar5 >= (int)uVar37) * uVar37;
  auVar8 = pmulld(auVar87,auVar7);
  auVar6 = pmulld(auVar76,auVar7);
  auVar16 = pmulld(auVar101,auVar7);
  auVar4 = pmulld(auVar60,auVar7);
  iVar13 = auVar6._0_4_ + auVar8._0_4_ + iVar71 >> 0xc;
  iVar9 = auVar4._0_4_ + auVar16._0_4_ + iVar71 >> 0xc;
  iVar10 = auVar4._4_4_ + auVar16._4_4_ + iVar74 >> 0xc;
  iVar12 = auVar4._8_4_ + auVar16._8_4_ + iVar75 >> 0xc;
  iVar11 = auVar4._12_4_ + auVar16._12_4_ + iVar78 >> 0xc;
  if (bit == 0) {
    palVar1 = (__m128i *)0xa;
    if (10 < do_cols) {
      palVar1 = out1;
    }
    iVar5 = 0x20 << ((byte)palVar1 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar5;
    clamp_hi_out[0]._0_4_ = iVar5 + -1;
    auVar106._0_8_ = (__m128i *)CONCAT44(iVar10,iVar9);
    auVar106._8_4_ = iVar12;
    auVar106._12_4_ = iVar11;
    in1_03[1] = (longlong)clamp_hi_out;
    in1_03[0] = (longlong)clamp_lo_out;
    in0_03[1] = (longlong)(out + 3);
    in0_03[0] = (longlong)(out + 1);
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    neg_shift_sse4_1(in0_03,in1_03,out0,palVar3,auVar106._0_8_,auVar106._8_8_,iVar13);
    in1_04[1] = (longlong)clamp_hi_out;
    in1_04[0] = (longlong)clamp_lo_out;
    in0_04[1] = (longlong)(out + 7);
    in0_04[0] = (longlong)(out + 5);
    neg_shift_sse4_1(in0_04,in1_04,out0,palVar3,auVar106._0_8_,auVar106._8_8_,iVar13);
    in1_05[1] = (longlong)clamp_hi_out;
    in1_05[0] = (longlong)clamp_lo_out;
    in0_05[1] = (longlong)(out + 0xb);
    in0_05[0] = (longlong)(out + 9);
    neg_shift_sse4_1(in0_05,in1_05,out0,palVar3,auVar106._0_8_,auVar106._8_8_,iVar13);
    in1_06[1] = (longlong)clamp_hi_out;
    in1_06[0] = (longlong)clamp_lo_out;
    in0_06[1] = (longlong)(out + 0xf);
    in0_06[0] = (longlong)(out + 0xd);
    neg_shift_sse4_1(in0_06,in1_06,out0,palVar3,auVar106._0_8_,auVar106._8_8_,iVar13);
  }
  else {
    *(uint *)out[1] = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
    *(uint *)(out[1] + 1) = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
    *(uint *)out[3] = -((uint)(iVar5 < (int)uVar85) * iVar5 | (iVar5 >= (int)uVar85) * uVar85);
    *(uint *)((long)out[3] + 4) =
         -((uint)(iVar5 < (int)uVar89) * iVar5 | (iVar5 >= (int)uVar89) * uVar89);
    *(uint *)(out[3] + 1) = -((uint)(iVar5 < (int)uVar92) * iVar5 | (iVar5 >= (int)uVar92) * uVar92)
    ;
    *(uint *)((long)out[3] + 0xc) =
         -((uint)(iVar5 < (int)uVar96) * iVar5 | (iVar5 >= (int)uVar96) * uVar96);
    *(int *)out[5] = iVar9;
    *(int *)((long)out[5] + 4) = iVar10;
    *(int *)(out[5] + 1) = iVar12;
    *(int *)((long)out[5] + 0xc) = iVar11;
    *(int *)out[7] = -iVar13;
    *(int *)((long)out[7] + 4) = -(auVar6._4_4_ + auVar8._4_4_ + iVar74 >> 0xc);
    *(int *)(out[7] + 1) = -(auVar6._8_4_ + auVar8._8_4_ + iVar75 >> 0xc);
    *(int *)((long)out[7] + 0xc) = -(auVar6._12_4_ + auVar8._12_4_ + iVar78 >> 0xc);
    *(int *)out[9] = (auVar8._0_4_ - auVar6._0_4_) + iVar71 >> 0xc;
    *(int *)((long)out[9] + 4) = (auVar8._4_4_ - auVar6._4_4_) + iVar74 >> 0xc;
    *(int *)(out[9] + 1) = (auVar8._8_4_ - auVar6._8_4_) + iVar75 >> 0xc;
    *(int *)((long)out[9] + 0xc) = (auVar8._12_4_ - auVar6._12_4_) + iVar78 >> 0xc;
    *(int *)out[0xb] = -((auVar16._0_4_ - auVar4._0_4_) + iVar71 >> 0xc);
    *(int *)((long)out[0xb] + 4) = -((auVar16._4_4_ - auVar4._4_4_) + iVar74 >> 0xc);
    *(int *)(out[0xb] + 1) = -((auVar16._8_4_ - auVar4._8_4_) + iVar75 >> 0xc);
    *(int *)((long)out[0xb] + 0xc) = -((auVar16._12_4_ - auVar4._12_4_) + iVar78 >> 0xc);
    *(uint *)out[0xd] = (uint)(iVar5 < (int)uVar58) * iVar5 | (iVar5 >= (int)uVar58) * uVar58;
    *(uint *)((long)out[0xd] + 4) =
         (uint)(iVar5 < (int)uVar61) * iVar5 | (iVar5 >= (int)uVar61) * uVar61;
    *(uint *)(out[0xd] + 1) = (uint)(iVar5 < (int)uVar64) * iVar5 | (iVar5 >= (int)uVar64) * uVar64;
    *(uint *)((long)out[0xd] + 0xc) =
         (uint)(iVar5 < (int)uVar68) * iVar5 | (iVar5 >= (int)uVar68) * uVar68;
    *(uint *)out[0xf] = -((uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59);
    *(uint *)((long)out[0xf] + 4) =
         -((uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62);
    *(uint *)(out[0xf] + 1) =
         -((uint)(iVar5 < (int)uVar66) * iVar5 | (iVar5 >= (int)uVar66) * uVar66);
    *(uint *)((long)out[0xf] + 0xc) =
         -((uint)(iVar5 < (int)uVar70) * iVar5 | (iVar5 >= (int)uVar70) * uVar70);
  }
  return;
}

Assistant:

static void iadst8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // Even 8 points: 0, 2, ..., 14
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[14], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[14], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[10], cospi20);
  x = _mm_mullo_epi32(in[4], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[10], cospi44);
  x = _mm_mullo_epi32(in[4], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[6], cospi36);
  x = _mm_mullo_epi32(in[8], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[6], cospi28);
  x = _mm_mullo_epi32(in[8], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[2], cospi52);
  x = _mm_mullo_epi32(in[12], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[2], cospi12);
  x = _mm_mullo_epi32(in[12], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[2] = _mm_sub_epi32(kZero, u[4]);
    out[4] = u[6];
    out[6] = _mm_sub_epi32(kZero, u[2]);
    out[8] = u[3];
    out[10] = _mm_sub_epi32(kZero, u[7]);
    out[12] = u[5];
    out[14] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 2, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 4, out + 6, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 8, out + 10, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 12, out + 14, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }

  // Odd 8 points: 1, 3, ..., 15
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[15], cospi4);
  x = _mm_mullo_epi32(in[1], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[15], cospi60);
  x = _mm_mullo_epi32(in[1], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[11], cospi20);
  x = _mm_mullo_epi32(in[5], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[11], cospi44);
  x = _mm_mullo_epi32(in[5], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[7], cospi36);
  x = _mm_mullo_epi32(in[9], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[7], cospi28);
  x = _mm_mullo_epi32(in[9], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[3], cospi52);
  x = _mm_mullo_epi32(in[13], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[3], cospi12);
  x = _mm_mullo_epi32(in[13], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[1] = u[0];
    out[3] = _mm_sub_epi32(kZero, u[4]);
    out[5] = u[6];
    out[7] = _mm_sub_epi32(kZero, u[2]);
    out[9] = u[3];
    out[11] = _mm_sub_epi32(kZero, u[7]);
    out[13] = u[5];
    out[15] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 1, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 5, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 9, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 13, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}